

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O2

void __thiscall Uniforms::unflagChange(Uniforms *this)

{
  Camera *pCVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  
  if (this->m_change == true) {
    this->m_change = false;
    for (p_Var3 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->data)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      bVar2 = UniformData::check((UniformData *)(p_Var3 + 2));
      this->m_change = (bool)(this->m_change | bVar2);
    }
  }
  for (p_Var4 = (this->super_Scene).lights._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->super_Scene).lights._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    *(undefined1 *)(*(long *)(p_Var4 + 2) + 0x20) = 0;
  }
  pCVar1 = (this->super_Scene).activeCamera;
  if (pCVar1 != (Camera *)0x0) {
    (pCVar1->super_Node).bChange = false;
  }
  return;
}

Assistant:

void Uniforms::unflagChange() {
    if (m_change) {
        m_change = false;

        // Flag all user uniforms as NOT changed
        for (UniformDataMap::iterator it = data.begin(); it != data.end(); ++it)
            m_change += it->second.check();
    }

    for (vera::LightsMap::iterator it = lights.begin(); it != lights.end(); ++it)
        it->second->bChange = false;

    if (activeCamera)
        activeCamera->bChange = false;
}